

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_enum_to_string_helper_function
          (t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string local_50;
  
  bVar3 = has_custom_ostream(this,&tenum->super_t_type);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"std::string to_string(const ",0x1c);
    bVar3 = this->gen_pure_enums_;
    iVar4 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::type&",7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," val) ",6);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"std::map<int, const char*>::const_iterator it = _",0x31);
    iVar4 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_VALUES_TO_NAMES.find(val);",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar2 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (it != _",0xb);
    iVar4 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_01,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_VALUES_TO_NAMES.end()) {",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"return std::string(it->second);",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} else {",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"return std::to_string(static_cast<int>(val));",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_enum_to_string_helper_function(std::ostream& out, t_enum* tenum) {
  if (!has_custom_ostream(tenum)) {
    out << "std::string to_string(const ";
    if (gen_pure_enums_) {
      out << tenum->get_name();
    } else {
      out << tenum->get_name() << "::type&";
    }
    out << " val) " ;
	scope_up(out);

    out << indent() << "std::map<int, const char*>::const_iterator it = _"
             << tenum->get_name() << "_VALUES_TO_NAMES.find(val);" << endl;
    out << indent() << "if (it != _" << tenum->get_name() << "_VALUES_TO_NAMES.end()) {" << endl;
    indent_up();
    out << indent() << "return std::string(it->second);" << endl;
    indent_down();
    out << indent() << "} else {" << endl;
    indent_up();
    out << indent() << "return std::to_string(static_cast<int>(val));" << endl;
    indent_down();
    out << indent() << "}" << endl;

    scope_down(out);
    out << endl;
  }
}